

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

void __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
insertnonleaf(BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this
             ,unsigned_long_long *key,int *cur,node **p,int *pp,locType *pos,locType wz)

{
  uint uVar1;
  int iVar2;
  locType *plVar3;
  node *pnVar4;
  undefined4 extraout_var_00;
  int iVar5;
  long lVar6;
  ulong uVar7;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar8;
  long lVar9;
  locType *plVar10;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar11;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  locType tmpp [101];
  unsigned_long_long tmpk [100];
  int local_69c;
  long local_698;
  locType local_690;
  locType local_688 [100];
  undefined8 local_368;
  unsigned_long_long auStack_358 [101];
  undefined4 extraout_var;
  
  lVar8 = (long)*cur;
  if (lVar8 == -1) {
    iVar2 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar3 = (locType *)CONCAT44(extraout_var,iVar2);
    this->root = extraout_RDX;
    this->depth = this->depth + 1;
    plVar10 = &this->root;
    *(undefined4 *)(plVar3 + 200) = 1;
    plVar3[0x65] = *key;
    *plVar3 = *pos;
    plVar3[1] = wz;
    pDVar11 = this->file;
LAB_0010c6ea:
    (*(pDVar11->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(pDVar11,plVar10);
    return;
  }
  uVar1 = pp[lVar8];
  lVar6 = (long)(int)uVar1;
  pnVar4 = p[lVar8];
  lVar9 = (long)pnVar4->sz;
  if (lVar9 < 99) {
    if ((int)uVar1 < pnVar4->sz) {
      do {
        pnVar4 = p[lVar8];
        pnVar4->keyvalue[lVar9] = pnVar4->keyvalue[lVar9 + -1];
        *(locType *)((long)&pnVar4->field_0 + lVar9 * 8 + 8) = (pnVar4->field_0).pointer[lVar9];
        lVar9 = lVar9 + -1;
      } while (lVar6 < lVar9);
      pnVar4 = p[lVar8];
    }
    pnVar4->keyvalue[lVar6] = *key;
    *(locType *)((long)&pnVar4->field_0 + lVar6 * 8 + 8) = wz;
    p[lVar8]->sz = p[lVar8]->sz + 1;
    pDVar11 = this->file;
    plVar10 = pos + *cur;
    goto LAB_0010c6ea;
  }
  local_688[0] = (pnVar4->field_0).pointer[0];
  if ((int)uVar1 < 1) {
    local_688[lVar6 + 1] = wz;
    auStack_358[lVar6] = *key;
  }
  else {
    uVar7 = 0;
    do {
      local_688[uVar7 + 1] = *(locType *)((long)&pnVar4->field_0 + uVar7 * 8 + 8);
      auStack_358[uVar7] = pnVar4->keyvalue[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    local_688[(ulong)uVar1 + 1] = wz;
    auStack_358[lVar6] = *key;
    if (0x62 < (int)uVar1) goto LAB_0010c789;
  }
  do {
    local_688[lVar6 + 2] = *(locType *)((long)&pnVar4->field_0 + lVar6 * 8 + 8);
    auStack_358[lVar6 + 1] = pnVar4->keyvalue[lVar6];
    iVar2 = (int)lVar6;
    lVar6 = lVar6 + 1;
  } while (iVar2 != 0x62);
LAB_0010c789:
  pnVar4->sz = 0x32;
  lVar9 = 0;
  do {
    (pnVar4->field_0).pointer[lVar9] = local_688[lVar9];
    pnVar4 = p[lVar8];
    pnVar4->keyvalue[lVar9] = auStack_358[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 < pnVar4->sz);
  (pnVar4->field_0).pointer[pnVar4->sz] = local_688[lVar9];
  iVar2 = (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[1])();
  local_698 = CONCAT44(extraout_var_00,iVar2);
  iVar2 = p[lVar8]->sz;
  uVar7 = (ulong)iVar2;
  if ((long)uVar7 < 99) {
    lVar9 = uVar7 + 1;
    do {
      iVar5 = (int)uVar7;
      *(locType *)(local_698 + (long)(iVar5 - iVar2) * 8) = local_688[lVar9];
      iVar2 = p[lVar8]->sz;
      *(unsigned_long_long *)(local_698 + 0x328 + (long)(iVar5 - iVar2) * 8) = auStack_358[lVar9];
      uVar7 = (ulong)(iVar5 + 1);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 100);
  }
  *(int *)(local_698 + 0x640) = 99 - iVar2;
  *(undefined8 *)(local_698 + (long)(99 - iVar2) * 8) = local_368;
  local_690 = extraout_RDX_00;
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])();
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(this->file,pos + *cur);
  local_69c = *cur + -1;
  insertnonleaf(this,auStack_358 + p[lVar8]->sz,&local_69c,p,pp,pos,local_690);
  return;
}

Assistant:

void insertnonleaf(const Key &key, const int &cur, node **p, int *pp, locType *pos, locType wz) {
            if (cur == -1) {
                auto lnk = file->newspace();
                root = lnk.second;
                node *x = lnk.first;
                ++depth;
                x->sz = 1;
                x->keyvalue[0] = key;
                x->pointer[0] = pos[0];
                x->pointer[1] = wz;
                file->save(root);
                return;
            }
            node *&x = p[cur];
            int i, j = pp[cur];
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->pointer[i + 1] = x->pointer[i];
                x->keyvalue[j] = key;
                x->pointer[j + 1] = wz;
                ++x->sz;
                file->save(pos[cur]);
            } else {
                locType tmpp[degree + 1];
                Key tmpk[degree];
                tmpp[0] = x->pointer[0];
                for (i = 0; i < j; ++i)tmpp[i + 1] = x->pointer[i + 1], tmpk[i] = x->keyvalue[i];
                tmpp[j + 1] = wz;
                tmpk[j] = key;
                for (i = j + 1; i < degree; ++i)tmpp[i + 1] = x->pointer[i], tmpk[i] = x->keyvalue[i - 1];
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[i];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = x->sz + 1; i < degree; ++i)
                    y->pointer[i - x->sz - 1] = tmpp[i], y->keyvalue[i - x->sz - 1] = tmpk[i];
                y->sz = degree - 1 - x->sz;
                y->pointer[y->sz] = tmpp[degree];
                file->save(lnk.second);
                file->save(pos[cur]);
                insertnonleaf(tmpk[x->sz], cur - 1, p, pp, pos, lnk.second);
            }
        }